

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void cast_string_realloc(uint16_t needed,char **str,uint16_t *used,uint16_t *size)

{
  char *pcVar1;
  LY_ERR *pLVar2;
  uint16_t *size_local;
  uint16_t *used_local;
  char **str_local;
  uint16_t needed_local;
  
  if ((int)((uint)*size - (uint)*used) < (int)(uint)needed) {
    do {
      *size = *size + 0x10;
    } while ((int)((uint)*size - (uint)*used) < (int)(uint)needed);
    pcVar1 = (char *)ly_realloc(*str,(ulong)*size);
    *str = pcVar1;
    if (*str == (char *)0x0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","cast_string_realloc");
    }
  }
  return;
}

Assistant:

static void
cast_string_realloc(uint16_t needed, char **str, uint16_t *used, uint16_t *size)
{
    if (*size - *used < needed) {
        do {
            *size += LYXP_STRING_CAST_SIZE_STEP;
        } while (*size - *used < needed);
        *str = ly_realloc(*str, *size * sizeof(char));
        if (!(*str)) {
            LOGMEM;
        }
    }
}